

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O0

int aes_crypt_xts_wrap(void *ctx,mbedtls_operation_t operation,size_t length,uchar *data_unit,
                      uchar *input,uchar *output)

{
  int iVar1;
  int local_4c;
  int mode;
  mbedtls_aes_xts_context *xts_ctx;
  uchar *output_local;
  uchar *input_local;
  uchar *data_unit_local;
  size_t length_local;
  mbedtls_operation_t operation_local;
  void *ctx_local;
  
  if (operation == MBEDTLS_DECRYPT) {
    local_4c = 0;
  }
  else {
    if (operation != MBEDTLS_ENCRYPT) {
      return -0x6100;
    }
    local_4c = 1;
  }
  iVar1 = mbedtls_aes_crypt_xts
                    ((mbedtls_aes_xts_context *)ctx,local_4c,length,data_unit,input,output);
  return iVar1;
}

Assistant:

static int aes_crypt_xts_wrap( void *ctx, mbedtls_operation_t operation,
                               size_t length,
                               const unsigned char data_unit[16],
                               const unsigned char *input,
                               unsigned char *output )
{
    mbedtls_aes_xts_context *xts_ctx = ctx;
    int mode;

    switch( operation )
    {
        case MBEDTLS_ENCRYPT:
            mode = MBEDTLS_AES_ENCRYPT;
            break;
        case MBEDTLS_DECRYPT:
            mode = MBEDTLS_AES_DECRYPT;
            break;
        default:
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    return mbedtls_aes_crypt_xts( xts_ctx, mode, length,
                                  data_unit, input, output );
}